

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_math.c
# Opt level: O3

REF_STATUS ref_math_normalize(REF_DBL *normal)

{
  undefined1 auVar1 [16];
  double dVar2;
  REF_STATUS RVar3;
  undefined8 in_R9;
  double dVar4;
  double dVar5;
  double dVar7;
  undefined1 auVar6 [16];
  double dVar8;
  
  auVar6 = *(undefined1 (*) [16])normal;
  dVar5 = auVar6._0_8_;
  dVar7 = auVar6._8_8_;
  dVar4 = normal[2];
  dVar2 = SQRT(dVar4 * dVar4 + dVar5 * dVar5 + dVar7 * dVar7);
  dVar8 = dVar2 * 1e+20;
  if (dVar8 <= -dVar8) {
    dVar8 = -dVar8;
  }
  if (dVar5 <= -dVar5) {
    dVar5 = -dVar5;
  }
  RVar3 = 4;
  if (dVar5 < dVar8) {
    if (dVar7 <= -dVar7) {
      dVar7 = -dVar7;
    }
    if (dVar7 < dVar8) {
      dVar7 = dVar4;
      if (dVar4 <= -dVar4) {
        dVar7 = -dVar4;
      }
      if (dVar7 < dVar8) {
        dVar4 = dVar4 / dVar2;
        auVar1._8_4_ = SUB84(dVar2,0);
        auVar1._0_8_ = dVar2;
        auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
        auVar6 = divpd(auVar6,auVar1);
        *(undefined1 (*) [16])normal = auVar6;
        normal[2] = dVar4;
        dVar4 = dVar4 * dVar4 + auVar6._0_8_ * auVar6._0_8_ + auVar6._8_8_ * auVar6._8_8_ + -1.0;
        if (dVar4 <= -dVar4) {
          dVar4 = -dVar4;
        }
        RVar3 = 0;
        if (1e-13 <= dVar4) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_math.c",
                 0x29,"ref_math_normalize","vector length not unity",in_R9,0);
          RVar3 = 1;
        }
      }
    }
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_math_normalize(REF_DBL *normal) {
  REF_DBL length;

  length = sqrt(ref_math_dot(normal, normal));

  if (!ref_math_divisible(normal[0], length) ||
      !ref_math_divisible(normal[1], length) ||
      !ref_math_divisible(normal[2], length))
    return REF_DIV_ZERO;

  normal[0] /= length;
  normal[1] /= length;
  normal[2] /= length;

  length = ref_math_dot(normal, normal);
  RAS((ABS(length - 1.0) < 1.0e-13), "vector length not unity");

  return REF_SUCCESS;
}